

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

xmlChar * xmlSAX2DecodeAttrEntities(xmlParserCtxtPtr ctxt,xmlChar *str,xmlChar *end)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  
  pxVar2 = str;
  do {
    if (end <= pxVar2) {
      return (xmlChar *)0x0;
    }
    xVar1 = *pxVar2;
    pxVar2 = pxVar2 + 1;
  } while (xVar1 != '&');
  ctxt->depth = ctxt->depth + 1;
  pxVar2 = xmlStringLenDecodeEntities(ctxt,str,(int)end - (int)str,1,'\0','\0','\0');
  ctxt->depth = ctxt->depth + -1;
  return pxVar2;
}

Assistant:

static xmlChar *
xmlSAX2DecodeAttrEntities(xmlParserCtxtPtr ctxt, const xmlChar *str,
                          const xmlChar *end) {
    const xmlChar *in;
    xmlChar *ret;

    in = str;
    while (in < end)
        if (*in++ == '&')
	    goto decode;
    return(NULL);
decode:
    ctxt->depth++;
    ret = xmlStringLenDecodeEntities(ctxt, str, end - str,
				     XML_SUBSTITUTE_REF, 0,0,0);
    ctxt->depth--;
    return(ret);
}